

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

uint16 google::protobuf::compiler::js::anon_unknown_0::DecodeUTF8Codepoint
                 (uint8 *bytes,size_t *length)

{
  ulong local_28;
  size_t expected;
  size_t *length_local;
  uint8 *bytes_local;
  
  if (*length == 0) {
    bytes_local._6_2_ = 0;
  }
  else {
    if ((*bytes & 0x80) == 0) {
      local_28 = 1;
    }
    else if ((*bytes & 0xe0) == 0xc0) {
      local_28 = 2;
    }
    else {
      if ((*bytes & 0xf0) != 0xe0) {
        *length = 0;
        return 0;
      }
      local_28 = 3;
    }
    if (*length < local_28) {
      *length = 0;
      bytes_local._6_2_ = 0;
    }
    else {
      *length = local_28;
      if (local_28 == 1) {
        bytes_local._6_2_ = (ushort)*bytes;
      }
      else if (local_28 == 2) {
        bytes_local._6_2_ = (*bytes & 0x1f) << 6 | bytes[1] & 0x3f;
      }
      else if (local_28 == 3) {
        bytes_local._6_2_ = (ushort)*bytes << 0xc | (bytes[1] & 0x3f) << 6 | bytes[2] & 0x3f;
      }
      else {
        bytes_local._6_2_ = 0;
      }
    }
  }
  return bytes_local._6_2_;
}

Assistant:

uint16 DecodeUTF8Codepoint(uint8* bytes, size_t* length) {
  if (*length == 0) {
    return 0;
  }
  size_t expected = 0;
  if ((*bytes & 0x80) == 0) {
    expected = 1;
  } else if ((*bytes & 0xe0) == 0xc0) {
    expected = 2;
  } else if ((*bytes & 0xf0) == 0xe0) {
    expected = 3;
  } else {
    // Too long -- don't accept.
    *length = 0;
    return 0;
  }

  if (*length < expected) {
    // Not enough bytes -- don't accept.
    *length = 0;
    return 0;
  }

  *length = expected;
  switch (expected) {
    case 1: return bytes[0];
    case 2: return ((bytes[0] & 0x1F) << 6)  |
                   ((bytes[1] & 0x3F) << 0);
    case 3: return ((bytes[0] & 0x0F) << 12) |
                   ((bytes[1] & 0x3F) << 6)  |
                   ((bytes[2] & 0x3F) << 0);
    default: return 0;
  }
}